

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O2

void __thiscall
TTD::SnapShot::EmitSnapshotToFile(SnapShot *this,FileWriter *writer,ThreadContext *threadContext)

{
  SnapContext *pSVar1;
  uint *puVar2;
  FunctionBodyResolveInfo *pFVar3;
  SnapObject *pSVar4;
  UnorderedArrayListLink *pUVar5;
  UnorderedArrayListLink *pUVar6;
  UnorderedArrayListLink *pUVar7;
  UnorderedArrayListLink *pUVar8;
  Separator SVar9;
  byte bVar10;
  uint32 uVar11;
  UnorderedArrayListLink *pUVar12;
  UnorderedArrayListLink *pUVar13;
  UnorderedArrayListLink *pUVar14;
  UnorderedArrayListLink *pUVar15;
  SnapContext *snapCtx;
  uint *puVar16;
  FunctionBodyResolveInfo *fbInfo;
  SnapObject *snpObject;
  SnapContext *pSVar17;
  uint *puVar18;
  FunctionBodyResolveInfo *pFVar19;
  SnapObject *pSVar20;
  UnorderedArrayListLink **ppUVar21;
  double dVar22;
  undefined1 local_68 [8];
  TTDTimer timer;
  uint64 usedSpace;
  uint64 reservedSpace;
  double local_38;
  
  local_68 = (undefined1  [8])0x0;
  timer.m_timer.data.cacheSysTime = -NAN;
  timer.m_timer.data.cacheTick = 0;
  reservedSpace = (uint64)threadContext;
  local_38 = PlatformAgnostic::DateTime::HiResTimer::Now((HiResTimer *)local_68);
  (*writer->_vptr_FileWriter[6])(writer,0);
  (*writer->_vptr_FileWriter[8])(writer,1);
  timer.m_timer.data.previousDifference = 0;
  usedSpace = 0;
  SlabAllocatorBase<0>::ComputeMemoryUsed
            (&this->m_slabAllocator,&timer.m_timer.data.previousDifference,&usedSpace);
  FileWriter::WriteDouble
            (writer,timeTotal,this->GCTime + this->MarkTime + this->ExtractTime,NoSeparator);
  FileWriter::WriteUInt64(writer,usedMemory,timer.m_timer.data.previousDifference,CommaSeparator);
  FileWriter::WriteUInt64(writer,reservedMemory,usedSpace,CommaSeparator);
  FileWriter::WriteDouble(writer,timeGC,this->GCTime,CommaSeparator);
  FileWriter::WriteDouble(writer,timeMark,this->MarkTime,CommaSeparator);
  FileWriter::WriteDouble(writer,timeExtract,this->ExtractTime,CommaSeparator);
  uVar11 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count(&this->m_ctxList);
  FileWriter::WriteLengthValue(writer,uVar11,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaAndBigSpaceSeparator);
  (*writer->_vptr_FileWriter[8])(writer,1);
  pSVar17 = (this->m_ctxList).m_inlineHeadBlock.CurrPos;
  pSVar1 = (this->m_ctxList).m_inlineHeadBlock.BlockData;
  pUVar12 = &(this->m_ctxList).m_inlineHeadBlock;
  snapCtx = (SnapContext *)0x0;
  if (pSVar1 != pSVar17) {
    snapCtx = pSVar1;
  }
  SVar9 = BigSpaceSeparator;
  do {
    pUVar5 = pUVar12->Next;
    do {
      do {
        pUVar12 = pUVar5;
        if (snapCtx == (SnapContext *)0x0) {
          (*writer->_vptr_FileWriter[8])(writer,0xffffffffffffffff);
          (*writer->_vptr_FileWriter[5])(writer,2);
          uVar11 = UnorderedArrayList<int,_32UL>::Count(&this->m_tcSymbolRegistrationMapContents);
          FileWriter::WriteLengthValue(writer,uVar11,CommaAndBigSpaceSeparator);
          FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
          puVar16 = (uint *)(this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.CurrPos;
          puVar2 = (uint *)(this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.BlockData;
          ppUVar21 = &(this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.Next;
          puVar18 = (uint *)0x0;
          bVar10 = 0;
          if (puVar2 != puVar16) {
            puVar18 = puVar2;
            bVar10 = 0;
          }
          do {
            pUVar6 = *ppUVar21;
            do {
              do {
                pUVar13 = pUVar6;
                if (puVar18 == (uint *)0x0) {
                  (*writer->_vptr_FileWriter[5])(writer,0);
                  FileWriter::WriteLogTag
                            (writer,ctxTag,this->m_activeScriptContext,CommaAndBigSpaceSeparator);
                  EmitListHelper<void(*)(TTD::NSSnapValues::SnapRootInfoEntry_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::SnapRootInfoEntry,512ul>
                            (SnapRootPinEntryEmit,&this->m_rootList,writer);
                  EmitListHelper<void(*)(TTD::NSSnapType::SnapHandler_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapType::SnapHandler,2048ul>
                            (NSSnapType::EmitSnapHandler,&this->m_handlerList,writer);
                  EmitListHelper<void(*)(TTD::NSSnapType::SnapType_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapType::SnapType,2048ul>
                            (NSSnapType::EmitSnapType,&this->m_typeList,writer);
                  uVar11 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::
                           Count(&this->m_functionBodyList);
                  FileWriter::WriteLengthValue(writer,uVar11,CommaAndBigSpaceSeparator);
                  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaAndBigSpaceSeparator);
                  (*writer->_vptr_FileWriter[8])(writer,1);
                  pFVar19 = (this->m_functionBodyList).m_inlineHeadBlock.CurrPos;
                  pFVar3 = (this->m_functionBodyList).m_inlineHeadBlock.BlockData;
                  pUVar14 = &(this->m_functionBodyList).m_inlineHeadBlock;
                  fbInfo = (FunctionBodyResolveInfo *)0x0;
                  if (pFVar3 != pFVar19) {
                    fbInfo = pFVar3;
                  }
                  SVar9 = BigSpaceSeparator;
                  do {
                    pUVar7 = pUVar14->Next;
                    do {
                      do {
                        pUVar14 = pUVar7;
                        if (fbInfo == (FunctionBodyResolveInfo *)0x0) {
                          (*writer->_vptr_FileWriter[8])(writer,0xffffffffffffffff);
                          (*writer->_vptr_FileWriter[5])(writer,2);
                          EmitListHelper<void(*)(TTD::NSSnapValues::SnapPrimitiveValue_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::SnapPrimitiveValue,4096ul>
                                    (NSSnapValues::EmitSnapPrimitiveValue,
                                     &this->m_primitiveObjectList,writer);
                          uVar11 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                                             (&this->m_compoundObjectList);
                          FileWriter::WriteLengthValue(writer,uVar11,CommaAndBigSpaceSeparator);
                          FileWriter::WriteSequenceStart_DefaultKey
                                    (writer,CommaAndBigSpaceSeparator);
                          (*writer->_vptr_FileWriter[8])(writer,1);
                          pSVar20 = (this->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
                          pSVar4 = (this->m_compoundObjectList).m_inlineHeadBlock.BlockData;
                          pUVar15 = &(this->m_compoundObjectList).m_inlineHeadBlock;
                          snpObject = (SnapObject *)0x0;
                          if (pSVar4 != pSVar20) {
                            snpObject = pSVar4;
                          }
                          SVar9 = BigSpaceSeparator;
                          do {
                            pUVar8 = pUVar15->Next;
                            do {
                              do {
                                pUVar15 = pUVar8;
                                if (snpObject == (SnapObject *)0x0) {
                                  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
                                  (*writer->_vptr_FileWriter[5])(writer,2);
                                  EmitListHelper<void(*)(TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::ScriptFunctionScopeInfo,2048ul>
                                            (NSSnapValues::EmitScriptFunctionScopeInfo,
                                             &this->m_scopeEntries,writer);
                                  EmitListHelper<void(*)(TTD::NSSnapValues::SlotArrayInfo_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::SlotArrayInfo,2048ul>
                                            (NSSnapValues::EmitSlotArrayInfo,
                                             &this->m_slotArrayEntries,writer);
                                  dVar22 = PlatformAgnostic::DateTime::HiResTimer::Now
                                                     ((HiResTimer *)local_68);
                                  FileWriter::WriteDouble
                                            (writer,timeWrite,(dVar22 - local_38) / 1000.0,
                                             CommaAndBigSpaceSeparator);
                                  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
                                  (*writer->_vptr_FileWriter[7])(writer,2);
                                  return;
                                }
                                NSSnapObjects::EmitObject
                                          (snpObject,writer,SVar9,this->m_snapObjectVTableArray,
                                           (ThreadContext *)reservedSpace);
                                snpObject = snpObject + 1;
                                SVar9 = CommaAndBigSpaceSeparator;
                                pUVar8 = pUVar15;
                              } while (snpObject != pSVar20);
                              snpObject = (SnapObject *)0x0;
                              pUVar8 = (UnorderedArrayListLink *)0x0;
                            } while (pUVar15 == (UnorderedArrayListLink *)0x0);
                            pSVar20 = pUVar15->CurrPos;
                            snpObject = pUVar15->BlockData;
                          } while( true );
                        }
                        NSSnapValues::EmitFunctionBodyInfo(fbInfo,writer,SVar9);
                        fbInfo = fbInfo + 1;
                        SVar9 = CommaAndBigSpaceSeparator;
                        pUVar7 = pUVar14;
                      } while (fbInfo != pFVar19);
                      fbInfo = (FunctionBodyResolveInfo *)0x0;
                      pUVar7 = (UnorderedArrayListLink *)0x0;
                    } while (pUVar14 == (UnorderedArrayListLink *)0x0);
                    pFVar19 = pUVar14->CurrPos;
                    fbInfo = pUVar14->BlockData;
                  } while( true );
                }
                (*writer->_vptr_FileWriter[0xe])(writer,(ulong)*puVar18,(ulong)bVar10);
                puVar18 = puVar18 + 1;
                bVar10 = 1;
                pUVar6 = pUVar13;
              } while (puVar18 != puVar16);
              bVar10 = 1;
              puVar18 = (uint *)0x0;
              pUVar6 = (UnorderedArrayListLink *)0x0;
            } while (pUVar13 == (UnorderedArrayListLink *)0x0);
            puVar16 = (uint *)pUVar13->CurrPos;
            puVar18 = (uint *)pUVar13->BlockData;
            ppUVar21 = &pUVar13->Next;
            bVar10 = 1;
          } while( true );
        }
        NSSnapValues::EmitSnapContext(snapCtx,writer,SVar9);
        snapCtx = snapCtx + 1;
        SVar9 = CommaAndBigSpaceSeparator;
        pUVar5 = pUVar12;
      } while (snapCtx != pSVar17);
      snapCtx = (SnapContext *)0x0;
      pUVar5 = (UnorderedArrayListLink *)0x0;
    } while (pUVar12 == (UnorderedArrayListLink *)0x0);
    pSVar17 = pUVar12->CurrPos;
    snapCtx = pUVar12->BlockData;
  } while( true );
}

Assistant:

void SnapShot::EmitSnapshotToFile(FileWriter* writer, ThreadContext* threadContext) const
    {
        TTDTimer timer;
        double startWrite = timer.Now();

        writer->WriteRecordStart();
        writer->AdjustIndent(1);

        uint64 usedSpace = 0;
        uint64 reservedSpace = 0;
        this->ComputeSnapshotMemory(&usedSpace, &reservedSpace);

        writer->WriteDouble(NSTokens::Key::timeTotal, this->GCTime + this->MarkTime + this->ExtractTime);
        writer->WriteUInt64(NSTokens::Key::usedMemory, usedSpace, NSTokens::Separator::CommaSeparator);
        writer->WriteUInt64(NSTokens::Key::reservedMemory, reservedSpace, NSTokens::Separator::CommaSeparator);
        writer->WriteDouble(NSTokens::Key::timeGC, this->GCTime, NSTokens::Separator::CommaSeparator);
        writer->WriteDouble(NSTokens::Key::timeMark, this->MarkTime, NSTokens::Separator::CommaSeparator);
        writer->WriteDouble(NSTokens::Key::timeExtract, this->ExtractTime, NSTokens::Separator::CommaSeparator);

        writer->WriteLengthValue(this->m_ctxList.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->AdjustIndent(1);
        bool firstCtx = true;
        for(auto iter = this->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            NSSnapValues::EmitSnapContext(iter.Current(), writer, firstCtx ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);

            firstCtx = false;
        }
        writer->AdjustIndent(-1);
        writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);

        writer->WriteLengthValue(this->m_tcSymbolRegistrationMapContents.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
        bool firstTCSymbol = true;
        for(auto iter = this->m_tcSymbolRegistrationMapContents.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            writer->WriteNakedUInt32((uint32)*iter.Current(), firstTCSymbol ? NSTokens::Separator::NoSeparator : NSTokens::Separator::CommaSeparator);

            firstTCSymbol = false;
        }
        writer->WriteSequenceEnd();

        writer->WriteLogTag(NSTokens::Key::ctxTag, this->m_activeScriptContext, NSTokens::Separator::CommaAndBigSpaceSeparator);
        SnapShot::EmitListHelper(&SnapShot::SnapRootPinEntryEmit, this->m_rootList, writer);

        ////
        SnapShot::EmitListHelper(&NSSnapType::EmitSnapHandler, this->m_handlerList, writer);
        SnapShot::EmitListHelper(&NSSnapType::EmitSnapType, this->m_typeList, writer);

        ////
        writer->WriteLengthValue(this->m_functionBodyList.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->AdjustIndent(1);
        bool firstBody = true;
        for(auto iter = this->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            NSSnapValues::EmitFunctionBodyInfo(iter.Current(), writer, firstBody ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);

            firstBody = false;
        }
        writer->AdjustIndent(-1);
        writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);

        SnapShot::EmitListHelper(&NSSnapValues::EmitSnapPrimitiveValue, this->m_primitiveObjectList, writer);

        writer->WriteLengthValue(this->m_compoundObjectList.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
        writer->AdjustIndent(1);
        bool firstObj = true;
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            NSSnapObjects::EmitObject(iter.Current(), writer, firstObj ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator, this->m_snapObjectVTableArray, threadContext);

            firstObj = false;
        }
        writer->AdjustIndent(-1);
        writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);

        ////
        SnapShot::EmitListHelper(&NSSnapValues::EmitScriptFunctionScopeInfo, this->m_scopeEntries, writer);
        SnapShot::EmitListHelper(&NSSnapValues::EmitSlotArrayInfo, this->m_slotArrayEntries, writer);

        ////
        double almostEndWrite = timer.Now();
        writer->WriteDouble(NSTokens::Key::timeWrite, (almostEndWrite - startWrite) / 1000.0, NSTokens::Separator::CommaAndBigSpaceSeparator);

        writer->AdjustIndent(-1);
        writer->WriteRecordEnd(NSTokens::Separator::BigSpaceSeparator);
    }